

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

double __thiscall
chrono::utils::ChISO2631_Vibration_SeatCushionLogger::GetAVGSpeed
          (ChISO2631_Vibration_SeatCushionLogger *this)

{
  pointer pdVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  double dVar6;
  undefined1 in_ZMM1 [64];
  
  pdVar1 = (this->m_data_speed).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->m_data_speed).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    dVar6 = 0.0;
    lVar4 = (long)pdVar2 - (long)pdVar1 >> 3;
    lVar5 = 0;
    do {
      dVar6 = dVar6 + pdVar1[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    auVar3 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,lVar4);
    return dVar6 / auVar3._0_8_;
  }
  return 0.0;
}

Assistant:

double ChISO2631_Vibration_SeatCushionLogger::GetAVGSpeed() const {
    return mean(m_data_speed);
}